

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O3

Calendar * __thiscall
icu_63::RelativeDateFormat::initializeCalendar
          (RelativeDateFormat *this,TimeZone *adoptZone,Locale *locale,UErrorCode *status)

{
  Calendar *pCVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (adoptZone == (TimeZone *)0x0) {
      adoptZone = TimeZone::createDefault();
    }
    pCVar1 = Calendar::createInstance(adoptZone,locale,status);
    (this->super_DateFormat).fCalendar = pCVar1;
    if (pCVar1 == (Calendar *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      pCVar1 = (Calendar *)0x0;
    }
  }
  else {
    pCVar1 = (this->super_DateFormat).fCalendar;
  }
  return pCVar1;
}

Assistant:

Calendar*
RelativeDateFormat::initializeCalendar(TimeZone* adoptZone, const Locale& locale, UErrorCode& status)
{
    if(!U_FAILURE(status)) {
        fCalendar = Calendar::createInstance(adoptZone?adoptZone:TimeZone::createDefault(), locale, status);
    }
    if (U_SUCCESS(status) && fCalendar == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return fCalendar;
}